

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

u16 __thiscall irr::scene::CXMeshFileLoader::readBinWord(CXMeshFileLoader *this)

{
  u16 tmp;
  CXMeshFileLoader *this_local;
  u16 local_2;
  
  if (*(c8 **)&(this->super_IMeshLoader).field_0x18 < this->End) {
    local_2 = **(u16 **)&(this->super_IMeshLoader).field_0x18;
    *(long *)&(this->super_IMeshLoader).field_0x18 =
         *(long *)&(this->super_IMeshLoader).field_0x18 + 2;
  }
  else {
    local_2 = 0;
  }
  return local_2;
}

Assistant:

u16 CXMeshFileLoader::readBinWord()
{
	if (P >= End)
		return 0;
#ifdef __BIG_ENDIAN__
	const u16 tmp = os::Byteswap::byteswap(*(u16 *)P);
#else
	const u16 tmp = *(u16 *)P;
#endif
	P += 2;
	return tmp;
}